

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_http_close_immortal(lws *wsi)

{
  lws *wsi_00;
  lws_log_cx *cx;
  char *pcVar1;
  int local_34;
  lws *nwsi;
  lws *wsi_local;
  
  if ((*(ulong *)&wsi->field_0x46e >> 1 & 1) != 0) {
    if ((*(ulong *)&wsi->field_0x46e >> 3 & 1) == 0) {
      __assert_fail("wsi->mux_stream_immortal",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x4ec,"void lws_http_close_immortal(struct lws *)");
    }
    *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xfffffffffffffff7;
    wsi_00 = lws_get_network_wsi(wsi);
    cx = lwsl_wsi_get_cx(wsi);
    pcVar1 = lws_wsi_tag(wsi_00);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_http_close_immortal","%s (%d)",pcVar1,
                (uint)wsi_00->immortal_substream_count);
    if (wsi_00->immortal_substream_count == '\0') {
      __assert_fail("nwsi->immortal_substream_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x4f2,"void lws_http_close_immortal(struct lws *)");
    }
    wsi_00->immortal_substream_count = wsi_00->immortal_substream_count + 0xff;
    if (wsi_00->immortal_substream_count == '\0') {
      if (((wsi->a).vhost)->keepalive_timeout == 0) {
        local_34 = 0x1f;
      }
      else {
        local_34 = ((wsi->a).vhost)->keepalive_timeout;
      }
      lws_set_timeout(wsi_00,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,local_34);
    }
  }
  return;
}

Assistant:

void
lws_http_close_immortal(struct lws *wsi)
{
	struct lws *nwsi;

	if (!wsi->mux_substream)
		return;

	assert(wsi->mux_stream_immortal);
	wsi->mux_stream_immortal = 0;

	nwsi = lws_get_network_wsi(wsi);
	lwsl_wsi_debug(wsi, "%s (%d)", lws_wsi_tag(nwsi),
				       nwsi->immortal_substream_count);
	assert(nwsi->immortal_substream_count);
	nwsi->immortal_substream_count--;
	if (!nwsi->immortal_substream_count)
		/*
		 * since we closed the only immortal stream on this nwsi, we
		 * need to reapply a normal timeout regime to the nwsi
		 */
		lws_set_timeout(nwsi, PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
				wsi->a.vhost->keepalive_timeout ?
				    wsi->a.vhost->keepalive_timeout : 31);
}